

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O1

void __thiscall sf::Font::Page::Page(Page *this,bool smooth)

{
  _Rb_tree_header *p_Var1;
  Texture *this_00;
  uint y;
  uint y_00;
  uint x;
  bool bVar2;
  Image image;
  IntRect local_68;
  Image local_50;
  
  p_Var1 = &(this->glyphs)._M_t._M_impl.super__Rb_tree_header;
  (this->glyphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->glyphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->glyphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->glyphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->glyphs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = &this->texture;
  Texture::Texture(this_00);
  this->nextRow = 3;
  (this->rows).super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rows).super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rows).super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Image::Image(&local_50);
  Color::Color((Color *)&local_68,0xff,0xff,0xff,'\0');
  Image::create(&local_50,0x80,0x80,(Color *)&local_68);
  x = 0;
  do {
    y_00 = 0;
    do {
      Color::Color((Color *)&local_68,0xff,0xff,0xff,0xff);
      Image::setPixel(&local_50,x,y_00,(Color *)&local_68);
      y_00 = y_00 + 1;
    } while (y_00 == 1);
    bVar2 = x == 0;
    x = x + 1;
  } while (bVar2);
  local_68.left = 0;
  local_68.top = 0;
  local_68.width = 0;
  local_68.height = 0;
  Texture::loadFromImage(this_00,&local_50,&local_68);
  Texture::setSmooth(this_00,smooth);
  Image::~Image(&local_50);
  return;
}

Assistant:

Font::Page::Page(bool smooth) :
nextRow(3)
{
    // Make sure that the texture is initialized by default
    sf::Image image;
    image.create(128, 128, Color(255, 255, 255, 0));

    // Reserve a 2x2 white square for texturing underlines
    for (unsigned int x = 0; x < 2; ++x)
        for (unsigned int y = 0; y < 2; ++y)
            image.setPixel(x, y, Color(255, 255, 255, 255));

    // Create the texture
    texture.loadFromImage(image);
    texture.setSmooth(smooth);
}